

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_encoder.cpp
# Opt level: O2

bool __thiscall LumaEncoder::run(LumaEncoder *this)

{
  uint frame_index;
  uint uVar1;
  
  frame_index = this->m_frameCount;
  uVar1 = (this->m_params).keyframeInterval;
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)(frame_index % uVar1 == 0);
  }
  this->m_frameCount = frame_index + 1;
  encode_frame_vpx(this,&this->m_codec,&this->m_rawFrame,frame_index,uVar1);
  return true;
}

Assistant:

bool LumaEncoder::run()
{
	int flags = 0;
	
	// Force key frame?
	if (m_params.keyframeInterval > 0 && m_frameCount % m_params.keyframeInterval == 0)
		flags = VPX_EFLAG_FORCE_KF;
    
    // Start encoder
	encode_frame_vpx(&m_codec, &m_rawFrame, m_frameCount++, flags);
	
	return true;
}